

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O1

Point<double> * __thiscall
Parfait::Facet::GetClosestPoint
          (Point<double> *__return_storage_ptr__,Facet *this,Point<double> safe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  (__return_storage_ptr__->pos)._M_elems[2] = safe.pos._M_elems[2];
  (__return_storage_ptr__->pos)._M_elems[0] = safe.pos._M_elems[0];
  (__return_storage_ptr__->pos)._M_elems[1] = safe.pos._M_elems[1];
  dVar1 = (this->points)._M_elems[0].pos._M_elems[0];
  dVar2 = (this->points)._M_elems[0].pos._M_elems[1];
  dVar12 = dVar1 - (__return_storage_ptr__->pos)._M_elems[0];
  dVar17 = dVar2 - (__return_storage_ptr__->pos)._M_elems[1];
  dVar3 = (this->points)._M_elems[0].pos._M_elems[2];
  dVar9 = (this->points)._M_elems[1].pos._M_elems[0] - dVar1;
  dVar10 = (this->points)._M_elems[1].pos._M_elems[1] - dVar2;
  dVar4 = (this->points)._M_elems[1].pos._M_elems[2] - dVar3;
  dVar6 = (this->points)._M_elems[2].pos._M_elems[0] - dVar1;
  dVar7 = (this->points)._M_elems[2].pos._M_elems[1] - dVar2;
  dVar8 = (this->points)._M_elems[2].pos._M_elems[2] - dVar3;
  dVar13 = dVar4 * dVar4 + dVar9 * dVar9 + dVar10 * dVar10;
  dVar11 = dVar4 * dVar8 + dVar9 * dVar6 + dVar10 * dVar7;
  dVar14 = dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7;
  dVar5 = dVar3 - (__return_storage_ptr__->pos)._M_elems[2];
  dVar15 = dVar5 * dVar4 + dVar12 * dVar9 + dVar17 * dVar10;
  dVar5 = dVar5 * dVar8 + dVar12 * dVar6 + dVar17 * dVar7;
  dVar17 = dVar11 * dVar5 - dVar15 * dVar14;
  dVar16 = dVar11 * dVar15 - dVar5 * dVar13;
  dVar12 = ABS(dVar13 * dVar14 - dVar11 * dVar11);
  if (dVar17 + dVar16 <= dVar12) {
    if (0.0 <= dVar17) {
      if (0.0 <= dVar16) {
        dVar12 = 1.0 / dVar12;
        dVar17 = dVar17 * dVar12;
        dVar14 = dVar16 * dVar12;
        goto LAB_0010ad77;
      }
      if (0.0 <= dVar15) goto LAB_0010ad58;
      if (dVar13 <= -dVar15) goto LAB_0010ad5f;
    }
    else {
      dVar17 = 0.0;
      if ((0.0 <= dVar16) || (0.0 <= dVar15)) {
        if (0.0 <= dVar5) goto LAB_0010ad2b;
        if (-dVar5 < dVar14) goto LAB_0010acac;
        goto LAB_0010ad6f;
      }
      if (dVar13 <= -dVar15) goto LAB_0010ad22;
    }
LAB_0010ad51:
    dVar17 = -dVar15 / dVar13;
    dVar14 = 0.0;
    goto LAB_0010ad77;
  }
  if (0.0 <= dVar17) {
    if (0.0 <= dVar16) {
      dVar15 = ((dVar5 + dVar14) - dVar11) - dVar15;
      if (0.0 < dVar15) {
        dVar14 = dVar14 + (dVar13 - (dVar11 + dVar11));
        if (dVar15 < dVar14) {
          dVar17 = dVar15 / dVar14;
          dVar14 = 1.0 - dVar17;
          goto LAB_0010ad77;
        }
        goto LAB_0010ad22;
      }
    }
    else {
      dVar12 = dVar13 + dVar15;
      if (dVar12 <= dVar5 + dVar11) {
        if (dVar12 <= 0.0) {
LAB_0010ad5f:
          dVar14 = 0.0;
          dVar17 = 1.0;
          goto LAB_0010ad77;
        }
        if (dVar15 < 0.0) goto LAB_0010ad51;
LAB_0010ad58:
        dVar14 = 0.0;
        dVar17 = 0.0;
        goto LAB_0010ad77;
      }
      dVar12 = dVar12 - (dVar5 + dVar11);
      dVar14 = dVar14 + (dVar13 - (dVar11 + dVar11));
      if (dVar12 < dVar14) {
        dVar14 = dVar12 / dVar14;
        dVar17 = 1.0 - dVar14;
        goto LAB_0010ad77;
      }
    }
LAB_0010ad6f:
    dVar17 = 0.0;
    dVar14 = 1.0;
  }
  else {
    dVar12 = dVar14 + dVar5;
    if (dVar12 <= dVar15 + dVar11) {
      dVar17 = 0.0;
      if (dVar12 <= 0.0) goto LAB_0010ad6f;
      if (dVar5 < 0.0) {
LAB_0010acac:
        dVar17 = 0.0;
        dVar14 = -dVar5 / dVar14;
        goto LAB_0010ad77;
      }
    }
    else {
      dVar12 = dVar12 - (dVar15 + dVar11);
      dVar14 = dVar14 + (dVar13 - (dVar11 + dVar11));
      if (dVar12 < dVar14) {
        dVar17 = dVar12 / dVar14;
        dVar14 = 1.0 - dVar17;
        goto LAB_0010ad77;
      }
LAB_0010ad22:
      dVar17 = 1.0;
    }
LAB_0010ad2b:
    dVar14 = 0.0;
  }
LAB_0010ad77:
  (__return_storage_ptr__->pos)._M_elems[0] = dVar6 * dVar14 + dVar1 + dVar9 * dVar17;
  (__return_storage_ptr__->pos)._M_elems[1] = dVar7 * dVar14 + dVar2 + dVar10 * dVar17;
  (__return_storage_ptr__->pos)._M_elems[2] = dVar8 * dVar14 + dVar3 + dVar4 * dVar17;
  return __return_storage_ptr__;
}

Assistant:

inline Parfait::Point<double> Parfait::Facet::GetClosestPoint(Point<double> safe) const {

    Point<double> point = safe;
    Point<double> diff = points[0] - point;
    const Point<double> edge0 = points[1] - points[0];
    const Point<double> edge1 = points[2] - points[0];

    double a00 = LocalMacroCrap::squaredMagnitude(edge0);
    double a01 = Point<double>::dot(edge0, edge1);
    double a11 = LocalMacroCrap::squaredMagnitude(edge1);
    double b0 = Point<double>::dot(diff, edge0);
    double b1 = Point<double>::dot(diff, edge1);
    double det = fabs(a00 * a11 - a01 * a01);
    double s = a01 * b1 - a11 * b0;
    double t = a01 * b0 - a00 * b1;
    /*
      \     |
       \reg2|
        \   |
         \  |
          \ |
           \|
            *points[1]
            |\
            | \
      reg3  |  \ reg1
            |   \
            |reg0\
            |     \
            |      \ points[0]
     -------*-------*------->s
            |P0      \
      reg4  | reg5    \ reg6
    */
    if (s + t <= det) {
        if (s < (double) 0) {
            if (t < (double) 0) {
                if (b0 < (double) 0) {
                    t = (double) 0;
                    if (-b0 >= a00)
                        s = (double) 1;
                    else
                        s = -b0 / a00;
                } else {
                    s = (double) 0;
                    if (b1 >= (double) 0)
                        t = (double) 0;
                    else if (-b1 >= a11)
                        t = (double) 1;
                    else
                        t = -b1 / a11;
                }
            } else {
                s = (double) 0;
                if (b1 >= (double) 0)
                    t = (double) 0;
                else if (-b1 >= a11)
                    t = (double) 1;
                else
                    t = -b1 / a11;
            }
        } else if (t < (double) 0) {
            t = (double) 0;
            if (b0 >= (double) 0)
                s = (double) 0;
            else if (-b0 >= a00)
                s = (double) 1;
            else
                s = -b0 / a00;
        } else {
            double invDet = ((double) 1) / det;
            s *= invDet;
            t *= invDet;
        }
    } else {
        double tmp0, tmpoints, numer, denom;

        if (s < (double) 0) {
            tmp0 = a01 + b0;
            tmpoints = a11 + b1;
            if (tmpoints > tmp0) {
                numer = tmpoints - tmp0;
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    s = (double) 1;
                    t = (double) 0;
                } else {
                    s = numer / denom;
                    t = (double) 1 - s;
                }
            } else {
                s = (double) 0;
                if (tmpoints <= (double) 0)
                    t = (double) 1;
                else if (b1 >= (double) 0)
                    t = (double) 0;
                else
                    t = -b1 / a11;
            }
        } else if (t < (double) 0) {
            tmp0 = a01 + b1;
            tmpoints = a00 + b0;
            if (tmpoints > tmp0) {
                numer = tmpoints - tmp0;
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    t = (double) 1;
                    s = (double) 0;
                } else {
                    t = numer / denom;
                    s = (double) 1 - t;
                }
            } else {
                t = (double) 0;
                if (tmpoints <= (double) 0)
                    s = (double) 1;
                else if (b0 >= (double) 0)
                    s = (double) 0;
                else
                    s = -b0 / a00;
            }
        } else {
            numer = a11 + b1 - a01 - b0;
            if (numer <= (double) 0) {
                s = (double) 0;
                t = (double) 1;
            } else {
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    s = (double) 1;
                    t = (double) 0;
                } else {
                    s = numer / denom;
                    t = (double) 1 - s;
                }
            }
        }
    }

    point = points[0] + s * edge0 + t * edge1;
    return point;
}